

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

void mcu8str_update_size(mcu8str *str)

{
  int iVar1;
  void *__ptr;
  uint uVar2;
  mcu8str_size_t mVar3;
  mcu8str *src;
  char *c_str;
  mcu8str mStack_38;
  mcu8str *pmStack_20;
  
  src = (mcu8str *)(ulong)str->buflen;
  mVar3 = 0;
  if ((mcu8str *)0x1 < src) {
    c_str = str->c_str;
    mVar3 = mctools_strlen(c_str,(mcu8str_size_t)src);
    if (str->buflen <= mVar3) {
      mcu8str_update_size_cold_1();
      uVar2 = src->size + 1;
      pmStack_20 = str;
      if (*(uint *)(c_str + 0xc) < uVar2) {
        mcu8str_create(&mStack_38,(ulong)src->size);
        mcu8str_assign(&mStack_38,src);
        __ptr = *(void **)c_str;
        *(char **)c_str = mStack_38.c_str;
        *(undefined8 *)(c_str + 8) = mStack_38._8_8_;
        iVar1 = *(int *)(c_str + 0x10);
        *(int *)(c_str + 0x10) = mStack_38.owns_memory;
        if (__ptr != (void *)0x0 && iVar1 != 0) {
          free(__ptr);
        }
      }
      else {
        memmove(*(void **)c_str,src->c_str,(ulong)uVar2);
        *(uint *)(c_str + 8) = src->size;
      }
      return;
    }
  }
  str->size = (uint)mVar3;
  return;
}

Assistant:

void mcu8str_update_size( mcu8str* str )
  {
    if ( str->buflen < 2 ) {
      //This handles not only empty strings, but also the special case of
      //buflen=0, size=0 which occurs after _create_empty or _deallocate:
      str->size = 0;
      assert( str->c_str[0] == '\0' );
      return;
    }
    mcu8str_size_t n = mctools_strlen( str->c_str, str->buflen );
    if ( n >= str->buflen ) {
      mctools_impl_error("mcu8str_update_size logic error");
      //return;
    }
    str->size = (unsigned)n;
  }